

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.c
# Opt level: O2

void mafilter_wt(double *sig,int N,double *weights,int window,double *oup)

{
  int iVar1;
  int iVar2;
  void *__ptr;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  double *pdVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  double dVar11;
  
  uVar10 = window / 2;
  iVar1 = uVar10 * 2;
  if (iVar1 == window) {
    iVar2 = N + window + -1;
  }
  else {
    uVar10 = (window + -1) / 2;
    iVar2 = N + uVar10 * 2;
  }
  __ptr = malloc((long)iVar2 * 8);
  uVar3 = 0;
  uVar5 = 0;
  if (0 < (int)uVar10) {
    uVar5 = (ulong)uVar10;
  }
  for (; uVar5 != uVar3; uVar3 = uVar3 + 1) {
    *(double *)((long)__ptr + uVar3 * 8) = *sig;
  }
  lVar6 = (long)(int)(uVar10 + N);
  lVar4 = (long)(int)uVar10;
  pdVar7 = sig;
  for (lVar8 = lVar4; lVar8 < lVar6; lVar8 = lVar8 + 1) {
    *(double *)((long)__ptr + lVar8 * 8) = *pdVar7;
    pdVar7 = pdVar7 + 1;
  }
  for (lVar8 = lVar6; lVar8 < iVar2; lVar8 = lVar8 + 1) {
    *(double *)((long)__ptr + lVar8 * 8) = sig[(long)N + -1];
  }
  if (iVar1 == window) {
    iVar1 = 0;
    for (lVar8 = lVar4; lVar8 < lVar6; lVar8 = lVar8 + 1) {
      dVar11 = 0.0;
      pdVar7 = weights;
      for (lVar9 = (long)iVar1; lVar9 < lVar8 + lVar4; lVar9 = lVar9 + 1) {
        dVar11 = dVar11 + *pdVar7 * *(double *)((long)__ptr + lVar9 * 8);
        pdVar7 = pdVar7 + 1;
      }
      oup[lVar8 - lVar4] = dVar11;
      iVar1 = iVar1 + 1;
    }
  }
  else {
    iVar1 = 0;
    for (lVar8 = lVar4; lVar8 < lVar6; lVar8 = lVar8 + 1) {
      dVar11 = 0.0;
      pdVar7 = weights;
      for (lVar9 = (long)iVar1; lVar9 <= lVar8 + lVar4; lVar9 = lVar9 + 1) {
        dVar11 = dVar11 + *pdVar7 * *(double *)((long)__ptr + lVar9 * 8);
        pdVar7 = pdVar7 + 1;
      }
      oup[lVar8 - lVar4] = dVar11;
      iVar1 = iVar1 + 1;
    }
  }
  free(__ptr);
  return;
}

Assistant:

void mafilter_wt(double *sig,int N, double *weights, int window,double *oup) {
	int odd,q,N2,i,j,ct;
	double sum;
	double *temp;
	
	/*  Accepts Normalized weights. 
	 *  If the weight is not normalized then normalize it by
	 *  dividing all the weights by the sum of all the weights
	 *  [1,1,1,1,1] normalizes to [1,1,1,1,1] / 5 = [0.2,0.2,0.2,0.2,0.2]
	 */ 
	
	odd = window - ((window/2) * 2);
	
	if (odd) {
		q = (window - 1 ) / 2; 
		N2 = N + (2 * q);
	} else {
		q = window / 2;
		N2 = N + (2 * q) - 1;
	}
	
	
	temp = (double*) malloc (sizeof(double) * N2);
	
	for (i = 0; i < q; ++i) {
		temp[i] = sig[0];
	}
	
	for (i = q; i < N + q; ++i) {
		temp[i] = sig[i - q];
	}
	
	for (i = N + q; i < N2; ++i) {
		temp[i] = sig[N-1];
	}
	
	if (odd) {
		for (i = q; i < N+q; ++i) {
			sum = 0.0;
			ct = 0;
			for (j = i - q; j < i + q + 1;j++) {
				sum += weights[ct] * temp[j];
				ct++;
			}
			oup[i-q] = sum;
		}  
	} else {
		for (i = q; i < N+q; ++i) {
			sum = 0.0;
			ct = 0;
			for (j = i - q; j < i + q;j++) {
				sum += weights[ct] * temp[j];
				ct++;
			}
			oup[i-q] = sum;
		}  
	}
	
	
	free(temp);
}